

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Allocator **ppAVar1;
  char *pcVar2;
  float fVar3;
  int *piVar4;
  pointer pOVar5;
  char cVar6;
  float fVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  float fVar12;
  long lVar13;
  int baseLine;
  vector<Object,_std::allocator<Object>_> objects;
  Extractor ex;
  float mean_vals [3];
  Size label_size;
  float norm_vals [3];
  float local_270;
  int local_26c;
  Mat out;
  value_type local_218;
  undefined8 uStack_200;
  Mat in;
  Net yolov2;
  Mat m;
  int local_88;
  int local_84;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar2 = argv[1];
    std::__cxx11::string::string((string *)&yolov2,pcVar2,(allocator *)&in);
    cv::imread((string *)&m,(int)&yolov2);
    if ((Allocator **)yolov2._vptr_Net != &yolov2.opt.blob_allocator) {
      operator_delete(yolov2._vptr_Net);
    }
    cVar6 = cv::Mat::empty();
    if (cVar6 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov2);
      yolov2.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&yolov2,"mobilenet_yolo.param");
      ncnn::Net::load_model(&yolov2,"mobilenet_yolo.bin");
      ncnn::Mat::from_pixels_resize(&in,local_80,2,local_84,local_88,0x1a0,0x1a0,(Allocator *)0x0);
      mean_vals[0] = 1.0;
      mean_vals[1] = 1.0;
      mean_vals[2] = 1.0;
      norm_vals[0] = 0.007843;
      norm_vals[1] = 0.007843;
      norm_vals[2] = 0.007843;
      ncnn::Mat::substract_mean_normalize(&in,(float *)0x0,norm_vals);
      ncnn::Mat::substract_mean_normalize(&in,mean_vals,(float *)0x0);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",&in);
      out.cstep = 0;
      out.data = (void *)0x0;
      out.refcount._0_4_ = 0;
      out.refcount._4_4_ = 0;
      out.elemsize._0_4_ = 0;
      out.elemsize._4_4_ = 0;
      out.elempack = 0;
      out.allocator = (Allocator *)0x0;
      out.dims = 0;
      out.w = 0;
      out.h = 0;
      out.d = 0;
      out.c = 0;
      ncnn::Extractor::extract(&ex,"detection_out",&out,0);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (0 < out.h) {
        lVar13 = 0;
        do {
          lVar9 = out.w * lVar13 * CONCAT44(out.elemsize._4_4_,(undefined4)out.elemsize);
          local_218.prob = *(float *)((long)out.data + lVar9 + 4);
          local_218.label = (int)*(float *)((long)out.data + lVar9);
          local_218.rect.x = *(float *)((long)out.data + lVar9 + 8) * (float)local_84;
          local_218.rect.y = *(float *)((long)out.data + lVar9 + 0xc) * (float)local_88;
          local_218.rect.height =
               *(float *)((long)out.data + lVar9 + 0x14) * (float)local_88 - local_218.rect.y;
          local_218.rect.width =
               *(float *)((long)out.data + lVar9 + 0x10) * (float)local_84 - local_218.rect.x;
          std::vector<Object,_std::allocator<Object>_>::push_back(&objects,&local_218);
          lVar13 = lVar13 + 1;
        } while (lVar13 < out.h);
      }
      piVar4 = (int *)CONCAT44(out.refcount._4_4_,out.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (out.allocator == (Allocator *)0x0) {
            if (out.data != (void *)0x0) {
              free(out.data);
            }
          }
          else {
            (*(out.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar4 = (int *)CONCAT44(in.refcount._4_4_,in.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (in.allocator == (Allocator *)0x0) {
            if (in.data != (void *)0x0) {
              free(in.data);
            }
          }
          else {
            (*(in.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolov2);
      cv::Mat::clone();
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar13 = 0;
        uVar11 = 0;
        do {
          pOVar5 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  SUB84((double)*(float *)((long)&(objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->prob +
                                          lVar13),0),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                    lVar13),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                    lVar13),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).width
                                    + lVar13),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).
                                            height + lVar13),
                  (ulong)*(uint *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->label + lVar13
                                  ));
          out.elemsize._0_4_ = 0;
          out.elemsize._4_4_ = 0;
          out.data = (void *)CONCAT44(out.data._4_4_,0x3010000);
          mean_vals[2] = (float)(int)ROUND(*(float *)((long)&(pOVar5->rect).width + lVar13));
          mean_vals[1] = (float)(int)ROUND(*(float *)((long)&(pOVar5->rect).y + lVar13));
          mean_vals[0] = (float)(int)ROUND(*(float *)((long)&(pOVar5->rect).x + lVar13));
          yolov2._vptr_Net = (_func_int **)0x406fe00000000000;
          yolov2.opt.lightmode = false;
          yolov2.opt._1_3_ = 0;
          yolov2.opt.num_threads = 0;
          yolov2.opt.blob_allocator = (Allocator *)0x0;
          yolov2.opt.workspace_allocator = (Allocator *)0x0;
          out.refcount = (int *)&in;
          cv::rectangle(&out,mean_vals,&yolov2,1,8,0);
          sprintf((char *)&yolov2,"%s %.1f%%",
                  SUB84((double)(*(float *)((long)&pOVar5->prob + lVar13) * 100.0),0),
                  (long)*(int *)((long)&DAT_003151c4 +
                                (long)*(int *)((long)&pOVar5->label + lVar13) * 4 + 4) + 0x3151c8);
          out.data = &out.elemsize;
          sVar8 = strlen((char *)&yolov2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out,&yolov2,(long)&yolov2._vptr_Net + sVar8);
          cv::getTextSize((string *)&label_size,(int)&out,0.5,0,(int *)0x1);
          if ((size_t *)out.data != &out.elemsize) {
            operator_delete(out.data);
          }
          fVar7 = (float)(int)*(float *)((long)&(pOVar5->rect).x + lVar13);
          fVar12 = (float)(int)((*(float *)((long)&(pOVar5->rect).y + lVar13) -
                                (float)label_size.height) - 0.0);
          if ((int)fVar12 < 1) {
            fVar12 = 0.0;
          }
          fVar3 = (float)(in.refcount._4_4_ - label_size.width);
          if (label_size.width + (int)fVar7 <= in.refcount._4_4_) {
            fVar3 = fVar7;
          }
          ex._vptr_Extractor._0_4_ = 0x3010000;
          norm_vals[1] = fVar12;
          norm_vals[0] = fVar3;
          norm_vals[2] = (float)label_size.width;
          out.data = (void *)0x406fe00000000000;
          out.refcount._0_4_ = 0;
          out.refcount._4_4_ = 0x406fe000;
          out.elemsize._0_4_ = 0;
          out.elemsize._4_4_ = 0x406fe000;
          out.elempack = 0;
          out._28_4_ = 0;
          ex.d = (ExtractorPrivate *)&in;
          cv::rectangle(&ex,norm_vals,&out,0xffffffff,8,0);
          ex._vptr_Extractor._0_4_ = 0x3010000;
          ex.d = (ExtractorPrivate *)&in;
          out.data = &out.elemsize;
          sVar8 = strlen((char *)&yolov2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out,&yolov2,(long)&yolov2._vptr_Net + sVar8);
          local_26c = (int)fVar12 + label_size.height;
          local_218.rect.x = 0.0;
          local_218.rect.y = 0.0;
          local_218.rect.width = 0.0;
          local_218.rect.height = 0.0;
          local_218.label = 0;
          local_218.prob = 0.0;
          uStack_200 = 0;
          local_270 = fVar3;
          cv::putText(0,&ex,&out,&local_270,0,&local_218,1,8,0);
          if ((size_t *)out.data != &out.elemsize) {
            operator_delete(out.data);
          }
          uVar11 = uVar11 + 1;
          lVar13 = lVar13 + 0x18;
        } while (uVar11 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      out.refcount = (int *)&in;
      ppAVar1 = &yolov2.opt.blob_allocator;
      yolov2.opt.blob_allocator =
           (Allocator *)CONCAT26(yolov2.opt.blob_allocator._6_2_,0x6567616d69);
      yolov2.opt.lightmode = true;
      yolov2.opt._1_3_ = 0;
      yolov2.opt.num_threads = 0;
      out.elemsize._0_4_ = 0;
      out.elemsize._4_4_ = 0;
      out.data = (void *)CONCAT44(out.data._4_4_,0x1010000);
      yolov2._vptr_Net = (_func_int **)ppAVar1;
      cv::imshow((string *)&yolov2,(_InputArray *)&out);
      if ((Allocator **)yolov2._vptr_Net != ppAVar1) {
        operator_delete(yolov2._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&in);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar10 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar2);
      iVar10 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar10 = -1;
  }
  return iVar10;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolov2(m, objects);

    draw_objects(m, objects);

    return 0;
}